

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O2

int fl_height(int font,int size)

{
  uint uVar1;
  uint uVar2;
  _func_int **pp_Var3;
  int iVar4;
  
  uVar1 = fl_graphics_driver->font_;
  uVar2 = fl_graphics_driver->size_;
  pp_Var3 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
  if (uVar2 == size && uVar1 == font) {
    iVar4 = (*pp_Var3[0x3a])();
    return iVar4;
  }
  (*pp_Var3[0x36])();
  iVar4 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)uVar1,(ulong)uVar2);
  return iVar4;
}

Assistant:

int fl_height(int font, int size) {
    if ( font == fl_font() && size == fl_size() ) return(fl_height());
    int tf = fl_font(), ts = fl_size();   // save
    fl_font(font,size);
    int height = fl_height();
    fl_font(tf,ts);                       // restore
    return(height);
}